

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O0

bool testFromCStr(String *str)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  ostream *poVar4;
  size_type sVar5;
  String *str_local;
  
  pcVar3 = cm::String::data(str);
  if (pcVar3 == cstr) {
    poVar4 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str.data() != cstr) failed on line "
                            );
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x89);
    std::operator<<(poVar4,"\n");
    str_local._7_1_ = false;
  }
  else {
    sVar5 = cm::String::size(str);
    if (sVar5 == 3) {
      pcVar3 = cm::String::data(str);
      iVar2 = strncmp(pcVar3,cstr,3);
      if (iVar2 == 0) {
        bVar1 = cm::String::is_stable(str);
        if (bVar1) {
          str_local._7_1_ = true;
        }
        else {
          poVar4 = std::operator<<((ostream *)&std::cout,
                                   "ASSERT_TRUE(str.is_stable()) failed on line ");
          poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8c);
          std::operator<<(poVar4,"\n");
          str_local._7_1_ = false;
        }
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cout,
                                 "ASSERT_TRUE(std::strncmp(str.data(), cstr, 3) == 0) failed on line "
                                );
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8b);
        std::operator<<(poVar4,"\n");
        str_local._7_1_ = false;
      }
    }
    else {
      poVar4 = std::operator<<((ostream *)&std::cout,"ASSERT_TRUE(str.size() == 3) failed on line ")
      ;
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,0x8a);
      std::operator<<(poVar4,"\n");
      str_local._7_1_ = false;
    }
  }
  return str_local._7_1_;
}

Assistant:

static bool testFromCStr(cm::String const& str)
{
  ASSERT_TRUE(str.data() != cstr);
  ASSERT_TRUE(str.size() == 3);
  ASSERT_TRUE(std::strncmp(str.data(), cstr, 3) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}